

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  add(1);
  add(2);
  add(3);
  add(4);
  add(5);
  print_list();
  delete_list();
  return 0;
}

Assistant:

int main() {

    add(1);
    add(2);
    add(3);
    add(4);
    add(5);

    print_list();

    delete_list();

    return 0;
}